

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogInstance.h
# Opt level: O2

void __thiscall gnilk::LogInstance::LogInstance(LogInstance *this,string *name,Ref *logInstance)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  
  this->_vptr_LogInstance = (_func_int **)&PTR__LogInstance_0023d670;
  std::__cxx11::string::string(&this->logName,name);
  (this->logger).super___shared_ptr<gnilk::Log,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1 = (logInstance->super___shared_ptr<gnilk::Log,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (logInstance->super___shared_ptr<gnilk::Log,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (logInstance->super___shared_ptr<gnilk::Log,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->logger).super___shared_ptr<gnilk::Log,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  (this->logger).super___shared_ptr<gnilk::Log,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var2;
  (logInstance->super___shared_ptr<gnilk::Log,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  return;
}

Assistant:

LogInstance(std::string name, Log::Ref logInstance) :
                logName(std::move(name)),
                logger(std::move(logInstance)) {

        }